

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifier.c
# Opt level: O1

int flatcc_verify_string_field
              (flatcc_table_verifier_descriptor_t *td,flatbuffers_voffset_t id,int required)

{
  uint uVar1;
  void *pvVar2;
  int iVar3;
  undefined8 in_RAX;
  uint uVar4;
  uint uVar5;
  flatbuffers_uoffset_t base;
  uint local_14;
  
  local_14 = (uint)((ulong)in_RAX >> 0x20);
  iVar3 = get_offset_field(td,id,required,&local_14);
  if (local_14 != 0 && iVar3 == 0) {
    pvVar2 = td->buf;
    uVar4 = *(int *)((long)pvVar2 + (ulong)local_14) + local_14;
    iVar3 = 0x11;
    if (local_14 < uVar4) {
      if ((uVar4 & 3) == 0 && (ulong)uVar4 + 4 <= (ulong)td->end) {
        uVar1 = *(uint *)((long)pvVar2 + (ulong)uVar4);
        uVar5 = td->end - (uVar4 + 4);
        if (uVar1 < uVar5) {
          iVar3 = 7;
          if (*(char *)((long)pvVar2 + (ulong)uVar1 + (ulong)(uVar4 + 4)) == '\0') {
            iVar3 = 0;
          }
        }
        else {
          iVar3 = (uint)(uVar1 < uVar5) * 9 + 8;
        }
      }
    }
  }
  return iVar3;
}

Assistant:

int flatcc_verify_string_field(flatcc_table_verifier_descriptor_t *td,
        voffset_t id, int required)
{
    uoffset_t base;

    check_field(td, id, required, base);
    return verify_string(td->buf, td->end, base, read_uoffset(td->buf, base));
}